

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_subqueryref.cpp
# Opt level: O3

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind
          (Binder *this,SubqueryRef *ref,optional_ptr<duckdb::CommonTableExpressionInfo,_true> cte)

{
  pointer puVar1;
  pointer pbVar2;
  pointer __val;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ClientContext *pCVar7;
  char cVar8;
  int iVar9;
  Binder *pBVar10;
  pointer pSVar11;
  pointer pBVar12;
  undefined4 extraout_var;
  pointer pBVar13;
  type subquery;
  type other;
  BoundSubqueryRef *in_RCX;
  pointer pcVar14;
  char cVar15;
  __hashtable *__h;
  string __str;
  string subquery_alias;
  undefined1 local_90 [16];
  ClientContext *pCStack_80;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> local_78;
  uint local_70;
  undefined1 local_68 [16];
  string local_58;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> local_38;
  
  local_38._M_head_impl = in_RCX;
  CreateBinder((Binder *)(local_90 + 8),
               (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p,
               (optional_ptr<duckdb::Binder,_true>)ref,REGULAR_BINDER);
  pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)(local_90 + 8));
  pBVar10->can_contain_nulls = true;
  if (in_RCX != (BoundSubqueryRef *)0x0) {
    pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)(local_90 + 8));
    optional_ptr<duckdb::CommonTableExpressionInfo,_true>::CheckValid
              ((optional_ptr<duckdb::CommonTableExpressionInfo,_true> *)&local_38);
    local_58._M_dataplus._M_p = (pointer)&pBVar10->bound_ctes;
    local_78._M_head_impl = local_38._M_head_impl;
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::CommonTableExpressionInfo>,duckdb::ReferenceHashFunction<duckdb::CommonTableExpressionInfo>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,true>>>>
              ((_Hashtable<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::reference_wrapper<duckdb::CommonTableExpressionInfo>,std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::CommonTableExpressionInfo>,duckdb::ReferenceHashFunction<duckdb::CommonTableExpressionInfo>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_58._M_dataplus._M_p);
  }
  pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)(local_90 + 8));
  pSVar11 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                          *)&cte.ptr[1].key_targets.
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            (&pSVar11->node);
  BindNode((Binder *)local_90,(QueryNode *)pBVar10);
  puVar1 = ((cte.ptr)->key_targets).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar4 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar4;
  if (puVar1 == (pointer)0x0) {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_68 + 0x10),"unnamed_subquery","");
  }
  else {
    pbVar2 = ((cte.ptr)->aliases).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_68 + 0x10),pbVar2,(long)&(pbVar2->_M_dataplus)._M_p + (long)puVar1);
  }
  pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)(local_90 + 8));
  ::std::__cxx11::string::operator=((string *)&pBVar10->alias,(string *)(local_68 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pBVar12 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
            operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                        *)local_90);
  iVar9 = (*pBVar12->_vptr_BoundQueryNode[2])(pBVar12);
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if (((cte.ptr)->key_targets).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    __val = ref[7].super_TableRef.alias._M_dataplus._M_p;
    ref[7].super_TableRef.alias._M_dataplus._M_p = __val + 1;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    ::std::__cxx11::string::_M_replace((ulong)(local_68 + 0x10),0,(char *)0x0,0x1de6dee);
    if ((pointer)0x1 < __val) {
      cVar15 = '\x01';
      if ((pointer)0x9 < __val) {
        pcVar14 = __val;
        cVar8 = '\x04';
        do {
          cVar15 = cVar8;
          if (pcVar14 < (pointer)0x64) {
            cVar15 = cVar15 + -2;
            goto LAB_011dce9b;
          }
          if (pcVar14 < (pointer)0x3e8) {
            cVar15 = cVar15 + -1;
            goto LAB_011dce9b;
          }
          if (pcVar14 < (pointer)0x2710) goto LAB_011dce9b;
          bVar3 = (pointer)0x1869f < pcVar14;
          pcVar14 = (pointer)((ulong)pcVar14 / 10000);
          cVar8 = cVar15 + '\x04';
        } while (bVar3);
        cVar15 = cVar15 + '\x01';
      }
LAB_011dce9b:
      local_78._M_head_impl = (BoundSubqueryRef *)local_68;
      ::std::__cxx11::string::_M_construct((ulong)&local_78,cVar15);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_78._M_head_impl,local_70,(unsigned_long)__val);
      ::std::__cxx11::string::_M_append(local_68 + 0x10,(ulong)local_78._M_head_impl);
      if (local_78._M_head_impl != (BoundSubqueryRef *)local_68) {
        operator_delete(local_78._M_head_impl);
      }
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)paVar4;
    ::std::__cxx11::string::_M_assign((string *)(local_68 + 0x10));
  }
  local_78._M_head_impl = (BoundSubqueryRef *)operator_new(0x30);
  pCVar7 = pCStack_80;
  uVar6 = local_90._8_8_;
  uVar5 = local_90._0_8_;
  local_90._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pCStack_80 = (ClientContext *)0x0;
  local_90._0_8_ =
       (tuple<duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>)0x0;
  *(undefined1 *)
   &(((element_type *)local_78._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
    __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = 2;
  ((element_type *)local_78._M_head_impl)->context = (ClientContext *)0x0;
  *(undefined ***)
   &(((element_type *)local_78._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
    __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__BoundSubqueryRef_0244c6c0;
  (((element_type *)local_78._M_head_impl)->CTE_bindings)._M_h._M_buckets = (__buckets_ptr)uVar6;
  (((element_type *)local_78._M_head_impl)->CTE_bindings)._M_h._M_bucket_count = (size_type)pCVar7;
  (((element_type *)local_78._M_head_impl)->CTE_bindings)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)uVar5;
  pBVar13 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
                          *)&local_78);
  subquery = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*(&pBVar13->subquery);
  BindContext::AddSubquery
            ((BindContext *)&ref[1].super_TableRef.alias._M_string_length,
             CONCAT44(extraout_var,iVar9),(string *)(local_68 + 0x10),(SubqueryRef *)cte.ptr,
             subquery);
  pBVar13 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
            ::operator->((unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
                          *)&local_78);
  other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar13->binder);
  MoveCorrelatedExpressions((Binder *)ref,other);
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((element_type *)local_90._0_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_90._0_8_)->__weak_this_).internal
                .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  if (pCStack_80 != (ClientContext *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_80);
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(SubqueryRef &ref, optional_ptr<CommonTableExpressionInfo> cte) {
	auto binder = Binder::CreateBinder(context, this);
	binder->can_contain_nulls = true;
	if (cte) {
		binder->bound_ctes.insert(*cte);
	}
	auto subquery = binder->BindNode(*ref.subquery->node);
	binder->alias = ref.alias.empty() ? "unnamed_subquery" : ref.alias;
	idx_t bind_index = subquery->GetRootIndex();
	string subquery_alias;
	if (ref.alias.empty()) {
		auto index = unnamed_subquery_index++;
		subquery_alias = "unnamed_subquery";
		;
		if (index > 1) {
			subquery_alias += to_string(index);
		}
	} else {
		subquery_alias = ref.alias;
	}
	auto result = make_uniq<BoundSubqueryRef>(std::move(binder), std::move(subquery));
	bind_context.AddSubquery(bind_index, subquery_alias, ref, *result->subquery);
	MoveCorrelatedExpressions(*result->binder);
	return std::move(result);
}